

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O1

TranslationBlock_conflict *
tb_gen_code_riscv32(CPUState_conflict *cpu,target_ulong_conflict pc,target_ulong_conflict cs_base,
                   uint32_t flags,int cflags)

{
  byte *pbVar1;
  ushort uVar2;
  int iVar3;
  TCGContext_conflict9 *s;
  CPUArchState_conflict25 *pCVar4;
  TCGContext_conflict9 *pTVar5;
  byte *pbVar6;
  uc_struct_conflict5 *uc;
  uintptr_t uVar7;
  uintptr_t *puVar8;
  PageDesc *pPVar9;
  tb_page_addr_t tVar10;
  TranslationBlock_conflict *pTVar11;
  ulong extraout_RAX;
  ulong uVar12;
  TranslationBlock_conflict *tb;
  ulong extraout_RAX_00;
  long lVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  undefined4 in_register_00000034;
  ulong uVar17;
  ulong in_R10;
  byte *pbVar18;
  byte *pbVar19;
  tb_page_addr_t phys2;
  byte bVar20;
  bool bVar21;
  bool bVar22;
  PageDesc *p2;
  PageDesc *p;
  PageDesc *local_80;
  uint local_78;
  undefined4 uStack_74;
  void *local_70;
  uint32_t local_68;
  uint local_64;
  target_ulong_conflict local_60;
  uint32_t local_5c;
  tb_page_addr_t local_58;
  undefined8 local_50;
  CPUArchState_conflict25 *local_48;
  CPUState_conflict *local_40;
  TranslationBlock_conflict *local_38;
  
  local_50 = CONCAT44(in_register_00000034,pc);
  s = cpu->uc->tcg_ctx;
  pCVar4 = (CPUArchState_conflict25 *)cpu->env_ptr;
  local_60 = cs_base;
  local_5c = flags;
  local_58 = get_page_addr_code_riscv32(pCVar4,pc);
  uVar15 = cflags | 0x10000;
  if (local_58 != 0xffffffffffffffff) {
    uVar15 = cflags;
  }
  uVar14 = cpu->cluster_index;
  tb = (TranslationBlock_conflict *)(ulong)uVar14;
  iVar3 = cpu->singlestep_enabled;
  pTVar11 = tcg_tb_alloc_riscv32(s);
  if (pTVar11 == (TranslationBlock_conflict *)0x0) {
LAB_00c2ab21:
    tb_gen_code_riscv32_cold_2();
    uVar12 = extraout_RAX_00;
LAB_00c2ab2b:
    (tb->tc).size = uVar12;
    s->code_gen_ptr =
         (void *)((long)local_70 + (in_R10 & 0xffffffff) + uVar12 + 0xf & 0xfffffffffffffff0);
    *(undefined1 (*) [16])(tb->jmp_list_next + 1) = (undefined1  [16])0x0;
    tb->jmp_list_head = 0;
    tb->jmp_list_next[0] = 0;
    tb->jmp_dest[1] = 0;
    if ((ulong)tb->jmp_reset_offset[0] != 0xffff) {
      tb_set_jmp_target_riscv32(tb,0,(ulong)tb->jmp_reset_offset[0] + (long)(tb->tc).ptr);
    }
    pCVar4 = local_48;
    if (tb->jmp_reset_offset[1] != 0xffff) {
      tb_set_jmp_target_riscv32(tb,1,(ulong)tb->jmp_reset_offset[1] + (long)(tb->tc).ptr);
    }
    uVar15 = ((uint)local_50 + (uint)tb->size) - 1 & 0xfffff000;
    phys2 = 0xffffffffffffffff;
    if (((uint)local_50 & 0xfffff000) != uVar15) {
      phys2 = get_page_addr_code_riscv32(pCVar4,uVar15);
    }
    tVar10 = local_58;
    uc = (uc_struct_conflict5 *)cpu->uc;
    local_80 = (PageDesc *)0x0;
    pTVar11 = tb;
    if (local_58 == 0xffffffffffffffff) {
      if ((tb->cflags & 0x10000) == 0) {
        __assert_fail("tb->cflags & CF_NOCACHE",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                      ,0x66c,
                      "TranslationBlock *tb_link_page(struct uc_struct *, TranslationBlock *, tb_page_addr_t, tb_page_addr_t)"
                     );
      }
      *(undefined4 *)tb->page_addr = 0xffffffff;
      *(undefined4 *)((long)tb->page_addr + 4) = 0xffffffff;
      *(undefined4 *)(tb->page_addr + 1) = 0xffffffff;
      *(undefined4 *)((long)tb->page_addr + 0xc) = 0xffffffff;
    }
    else {
      page_lock_pair((uc_struct_conflict12 *)uc,(PageDesc **)&local_78,local_58,&local_80,phys2,1);
      puVar8 = (uintptr_t *)CONCAT44(uStack_74,local_78);
      uVar12 = (ulong)((uint)tVar10 & 0xfffff000);
      tb->page_addr[0] = uVar12;
      tb->page_next[0] = *puVar8;
      uVar7 = *puVar8;
      *puVar8 = (uintptr_t)tb;
      g_free((gpointer)puVar8[1]);
      puVar8[1] = 0;
      *(undefined4 *)(puVar8 + 2) = 0;
      if (uVar7 == 0) {
        tlb_protect_code_riscv32((uc_struct_conflict12 *)uc,uVar12);
      }
      pPVar9 = local_80;
      if (local_80 == (PageDesc *)0x0) {
        tb->page_addr[1] = 0xffffffffffffffff;
      }
      else {
        tb->page_addr[1] = phys2;
        tb->page_next[1] = local_80->first_tb;
        uVar7 = local_80->first_tb;
        local_80->first_tb = (ulong)tb | 1;
        g_free(local_80->code_bitmap);
        pPVar9->code_bitmap = (unsigned_long *)0x0;
        pPVar9->code_write_count = 0;
        if (uVar7 == 0) {
          tlb_protect_code_riscv32((uc_struct_conflict12 *)uc,phys2);
        }
      }
      if ((tb->cflags >> 0x10 & 1) == 0) {
        local_38 = (TranslationBlock_conflict *)0x0;
        uVar15 = (int)local_58 * -0x7a143589 + 0x24234429;
        uVar14 = uVar15 * 0x2000 | uVar15 >> 0x13;
        uVar15 = (int)(local_58 >> 0x20) * -0x7a143589 + 0x85ebca78;
        uVar15 = uVar15 * 0x2000 | uVar15 >> 0x13;
        uVar16 = tb->pc * -0x7a143589 + 1;
        uVar16 = uVar16 * 0x2000 | uVar16 >> 0x13;
        uVar15 = (uVar16 * 0x779b1000 | uVar16 * -0x61c8864f >> 0x14) +
                 tb->flags * -0x3d4d51c3 +
                 (uVar14 * 0x3c6ef362 | (uint)((int)(uVar14 * -0x61c8864f) < 0)) +
                 (uVar15 * 0x1bbcd880 | uVar15 * -0x61c8864f >> 0x19) + 0x91a7a6fd;
        uVar15 = (tb->cflags & 0xff0affff) * -0x3d4d51c3 +
                 (uVar15 * 0x20000 | uVar15 >> 0xf) * 0x27d4eb2f;
        uVar15 = tb->trace_vcpu_dstate * -0x3d4d51c3 +
                 (uVar15 * 0x20000 | uVar15 >> 0xf) * 0x27d4eb2f;
        uVar15 = (uVar15 * 0x20000 | uVar15 >> 0xf) * 0x27d4eb2f;
        uVar15 = (uVar15 >> 0xf ^ uVar15) * -0x7a143589;
        uVar15 = (uVar15 >> 0xd ^ uVar15) * -0x3d4d51c3;
        uVar15 = uVar15 >> 0x10 ^ uVar15;
        tb->hash = uVar15;
        qht_insert(uc,(qht *)(uc->tcg_ctx->gen_insn_data[0xaa] + 2),tb,uVar15,&local_38);
        if (local_38 != (TranslationBlock_conflict *)0x0) {
          tb_page_remove((PageDesc *)CONCAT44(uStack_74,local_78),tb);
          lVar13 = CONCAT44(uStack_74,local_78);
          g_free(*(gpointer *)(lVar13 + 8));
          *(undefined8 *)(lVar13 + 8) = 0;
          *(undefined4 *)(lVar13 + 0x10) = 0;
          pTVar11 = local_38;
          if (local_80 != (PageDesc *)0x0) {
            tb_page_remove(local_80,tb);
            pPVar9 = local_80;
            g_free(local_80->code_bitmap);
            pPVar9->code_bitmap = (unsigned_long *)0x0;
            pPVar9->code_write_count = 0;
            pTVar11 = local_38;
          }
        }
      }
    }
    if (pTVar11 == tb) {
      tcg_tb_insert_riscv32(s,tb);
      pTVar11 = tb;
    }
    else {
      lVar13 = (long)s->uc->qemu_icache_linesize;
      s->code_gen_ptr = (void *)((long)local_70 - (-lVar13 & lVar13 + 0x97U));
    }
    return pTVar11;
  }
  local_68 = uVar14 << 0x18 | uVar15 & 0xffffff;
  uVar15 = uVar15 & 0x7fff;
  uVar14 = 0x200;
  if (uVar15 < 0x200) {
    uVar14 = uVar15;
  }
  if (uVar15 == 0) {
    uVar14 = 0x200;
  }
  uVar15 = 1;
  if (iVar3 == 0) {
    uVar15 = uVar14;
  }
  local_40 = (CPUState_conflict *)(pCVar4[-0x26].pmp_state.pmp + 5);
  tb = pTVar11;
  local_48 = pCVar4;
LAB_00c2a916:
  local_70 = s->code_gen_ptr;
  (tb->tc).ptr = local_70;
  tb->pc = (target_ulong_conflict)local_50;
  tb->cs_base = local_60;
  tb->flags = local_5c;
  tb->cflags = local_68;
  tb->orig_tb = (TranslationBlock_conflict *)0x0;
  tb->trace_vcpu_dstate = (uint32_t)cpu->trace_dstate[0];
  s->tb_cflags = local_68;
  do {
    tcg_func_start_riscv32(s);
    s->cpu = local_40;
    local_64 = uVar15;
    gen_intermediate_code_riscv32(cpu,tb,uVar15);
    s->cpu = (CPUState_conflict *)0x0;
    tb->jmp_reset_offset[0] = 0xffff;
    tb->jmp_reset_offset[1] = 0xffff;
    s->tb_jmp_reset_offset = tb->jmp_reset_offset;
    s->tb_jmp_insn_offset = tb->jmp_target_arg;
    s->tb_jmp_target_addr = (uintptr_t *)0x0;
    uVar15 = tcg_gen_code_riscv32(s,tb);
    if (-1 < (int)uVar15) {
      uVar12 = (ulong)uVar15;
      pbVar1 = (byte *)((long)local_70 + uVar12);
      uVar2 = tb->icount;
      pbVar18 = pbVar1;
      if ((ulong)uVar2 == 0) goto LAB_00c2aaef;
      pTVar5 = cpu->uc->tcg_ctx;
      pbVar6 = (byte *)pTVar5->code_gen_highwater;
      uVar17 = 0;
      goto LAB_00c2aa28;
    }
    tb_gen_code_riscv32_cold_1();
    uVar15 = local_78;
  } while ((extraout_RAX & 1) == 0);
  goto LAB_00c2ab04;
  while (uVar17 = uVar17 + 1, uVar17 != uVar2) {
LAB_00c2aa28:
    pTVar11 = (TranslationBlock_conflict *)(pTVar5->gen_insn_data + (uVar17 - 1));
    if (uVar17 == 0) {
      pTVar11 = tb;
    }
    uVar15 = pTVar5->gen_insn_data[uVar17][0] - pTVar11->pc;
    do {
      uVar14 = (int)uVar15 >> 7;
      bVar21 = 0x3f < uVar15;
      bVar22 = (uVar15 & 0x40) == 0;
      pbVar19 = pbVar18 + 1;
      bVar20 = (byte)uVar15 | 0x80;
      if (!bVar21 || !bVar22 && uVar14 == 0xffffffff) {
        bVar20 = (byte)uVar15 & 0x7f;
      }
      *pbVar18 = bVar20;
      pbVar18 = pbVar19;
      uVar15 = uVar14;
    } while (bVar21 && (bVar22 || uVar14 != 0xffffffff));
    if (uVar17 == 0) {
      uVar15 = 0;
    }
    else {
      uVar15 = (uint)pTVar5->gen_insn_end_off[uVar17 - 1];
    }
    uVar15 = pTVar5->gen_insn_end_off[uVar17] - uVar15;
    do {
      uVar14 = (int)uVar15 >> 7;
      bVar21 = 0x3f < uVar15;
      bVar22 = (uVar15 & 0x40) == 0;
      pbVar18 = pbVar19 + 1;
      bVar20 = (byte)uVar15 | 0x80;
      if (!bVar21 || !bVar22 && uVar14 == 0xffffffff) {
        bVar20 = (byte)uVar15 & 0x7f;
      }
      *pbVar19 = bVar20;
      pbVar19 = pbVar18;
      uVar15 = uVar14;
    } while (bVar21 && (bVar22 || uVar14 != 0xffffffff));
    if (pbVar6 < pbVar18) {
      in_R10 = 0xffffffff;
      goto LAB_00c2aafa;
    }
  }
LAB_00c2aaef:
  in_R10 = (ulong)(uint)((int)pbVar18 - (int)pbVar1);
LAB_00c2aafa:
  if (-1 < (int)in_R10) goto LAB_00c2ab2b;
LAB_00c2ab04:
  tb = tcg_tb_alloc_riscv32(s);
  uVar15 = local_64;
  if (tb == (TranslationBlock_conflict *)0x0) goto LAB_00c2ab21;
  goto LAB_00c2a916;
}

Assistant:

TranslationBlock *tb_gen_code(CPUState *cpu,
                              target_ulong pc, target_ulong cs_base,
                              uint32_t flags, int cflags)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    TCGContext *tcg_ctx = cpu->uc->tcg_ctx;
    CPUArchState *env = cpu->env_ptr;
    TranslationBlock *tb, *existing_tb;
    tb_page_addr_t phys_pc, phys_page2;
    target_ulong virt_page2;
    tcg_insn_unit *gen_code_buf;
    int gen_code_size, search_size, max_insns;

    assert_memory_lock();
#ifdef HAVE_PTHREAD_JIT_PROTECT
    tb_exec_unlock(tcg_ctx);
#endif
    phys_pc = get_page_addr_code(env, pc);

    if (phys_pc == -1) {
        /* Generate a temporary TB; do not cache */
        cflags |= CF_NOCACHE;
    }

    cflags &= ~CF_CLUSTER_MASK;
    cflags |= ((uint32_t)cpu->cluster_index) << CF_CLUSTER_SHIFT;

    max_insns = cflags & CF_COUNT_MASK;
    if (max_insns == 0) {
        max_insns = CF_COUNT_MASK;
    }
    if (max_insns > TCG_MAX_INSNS) {
        max_insns = TCG_MAX_INSNS;
    }
    if (cpu->singlestep_enabled) {
        max_insns = 1;
    }

 buffer_overflow:
    tb = tcg_tb_alloc(tcg_ctx);
    if (unlikely(!tb)) {
        /* flush must be done */
        tb_flush(cpu);
        mmap_unlock();
        /* Make the execution loop process the flush as soon as possible.  */
        cpu->exception_index = EXCP_INTERRUPT;
        cpu_loop_exit(cpu);
    }

    gen_code_buf = tcg_ctx->code_gen_ptr;
    tb->tc.ptr = gen_code_buf;
    tb->pc = pc;
    tb->cs_base = cs_base;
    tb->flags = flags;
    tb->cflags = cflags;
    tb->orig_tb = NULL;
    tb->trace_vcpu_dstate = *cpu->trace_dstate;
    tcg_ctx->tb_cflags = cflags;
 tb_overflow:

    tcg_func_start(tcg_ctx);

    tcg_ctx->cpu = env_cpu(env);
    UC_TRACE_START(UC_TRACE_TB_TRANS);
    gen_intermediate_code(cpu, tb, max_insns);
    UC_TRACE_END(UC_TRACE_TB_TRANS, "[uc] translate tb 0x%" PRIx64 ": ", tb->pc);
    tcg_ctx->cpu = NULL;

    /* generate machine code */
    tb->jmp_reset_offset[0] = TB_JMP_RESET_OFFSET_INVALID;
    tb->jmp_reset_offset[1] = TB_JMP_RESET_OFFSET_INVALID;
    tcg_ctx->tb_jmp_reset_offset = tb->jmp_reset_offset;
    if (TCG_TARGET_HAS_direct_jump) {
        tcg_ctx->tb_jmp_insn_offset = tb->jmp_target_arg;
        tcg_ctx->tb_jmp_target_addr = NULL;
    } else {
        tcg_ctx->tb_jmp_insn_offset = NULL;
        tcg_ctx->tb_jmp_target_addr = tb->jmp_target_arg;
    }

    gen_code_size = tcg_gen_code(tcg_ctx, tb);
    if (unlikely(gen_code_size < 0)) {
        switch (gen_code_size) {
        case -1:
            /*
             * Overflow of code_gen_buffer, or the current slice of it.
             *
             * TODO: We don't need to re-do gen_intermediate_code, nor
             * should we re-do the tcg optimization currently hidden
             * inside tcg_gen_code.  All that should be required is to
             * flush the TBs, allocate a new TB, re-initialize it per
             * above, and re-do the actual code generation.
             */
            goto buffer_overflow;

        case -2:
            /*
             * The code generated for the TranslationBlock is too large.
             * The maximum size allowed by the unwind info is 64k.
             * There may be stricter constraints from relocations
             * in the tcg backend.
             *
             * Try again with half as many insns as we attempted this time.
             * If a single insn overflows, there's a bug somewhere...
             */
            max_insns = tb->icount;
            assert(max_insns > 1);
            max_insns /= 2;
            goto tb_overflow;

        default:
            g_assert_not_reached();
        }
    }
    search_size = encode_search(cpu->uc, tb, (uint8_t *)gen_code_buf + gen_code_size);
    if (unlikely(search_size < 0)) {
        goto buffer_overflow;
    }
    tb->tc.size = gen_code_size;

    tcg_ctx->code_gen_ptr = (void *)
        ROUND_UP((uintptr_t)gen_code_buf + gen_code_size + search_size,
                 CODE_GEN_ALIGN);

    /* init jump list */
    tb->jmp_list_head = (uintptr_t)NULL;
    tb->jmp_list_next[0] = (uintptr_t)NULL;
    tb->jmp_list_next[1] = (uintptr_t)NULL;
    tb->jmp_dest[0] = (uintptr_t)NULL;
    tb->jmp_dest[1] = (uintptr_t)NULL;

    /* init original jump addresses which have been set during tcg_gen_code() */
    if (tb->jmp_reset_offset[0] != TB_JMP_RESET_OFFSET_INVALID) {
        tb_reset_jump(tb, 0);
    }
    if (tb->jmp_reset_offset[1] != TB_JMP_RESET_OFFSET_INVALID) {
        tb_reset_jump(tb, 1);
    }

    /* check next page if needed */
    virt_page2 = (pc + tb->size - 1) & TARGET_PAGE_MASK;
    phys_page2 = -1;
    if ((pc & TARGET_PAGE_MASK) != virt_page2) {
        phys_page2 = get_page_addr_code(env, virt_page2);
    }
    /*
     * No explicit memory barrier is required -- tb_link_page() makes the
     * TB visible in a consistent state.
     */
    existing_tb = tb_link_page(cpu->uc, tb, phys_pc, phys_page2);
    /* if the TB already exists, discard what we just translated */
    if (unlikely(existing_tb != tb)) {
        uintptr_t orig_aligned = (uintptr_t)gen_code_buf;

        orig_aligned -= ROUND_UP(sizeof(*tb), tcg_ctx->uc->qemu_icache_linesize);
        tcg_ctx->code_gen_ptr = (void *)orig_aligned;
        return existing_tb;
    }
    tcg_tb_insert(tcg_ctx, tb);
    return tb;
}